

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Delaunay_psm.cpp
# Opt level: O2

void __thiscall
GEO::PeriodicDelaunay3dThread::get_lifted_vertex
          (PeriodicDelaunay3dThread *this,index_t v,double *result)

{
  bool bVar1;
  double *pdVar2;
  ulong uVar3;
  long lVar4;
  ulong uVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  
  uVar5 = (ulong)v;
  bVar1 = this->periodic_;
  if (bVar1 == true) {
    uVar5 = (ulong)(this->super_Periodic).nb_vertices_non_periodic_;
    uVar3 = v / uVar5;
    uVar5 = (ulong)v % uVar5;
  }
  else {
    uVar3 = 0;
  }
  pdVar2 = this->vertices_;
  dVar7 = pdVar2[(uint)((int)uVar5 * 3)];
  *result = dVar7;
  dVar6 = pdVar2[(int)uVar5 * 3 + 1];
  result[1] = dVar6;
  dVar8 = pdVar2[uVar5 * 3 + 2 & 0xffffffff];
  result[2] = dVar8;
  if (this->weights_ == (double *)0x0) {
    dVar9 = 0.0;
  }
  else {
    dVar9 = this->weights_[uVar5];
  }
  result[3] = -dVar9;
  if (bVar1 != false) {
    lVar4 = uVar3 * 0xc;
    dVar7 = dVar7 + (double)*(int *)(Periodic::translation + lVar4) * this->period_;
    *result = dVar7;
    dVar6 = dVar6 + (double)*(int *)(Periodic::translation + lVar4 + 4) * this->period_;
    result[1] = dVar6;
    dVar8 = dVar8 + (double)*(int *)(Periodic::translation + lVar4 + 8) * this->period_;
    result[2] = dVar8;
  }
  result[3] = (dVar8 * dVar8 + dVar6 * dVar6 + dVar7 * dVar7) - dVar9;
  return;
}

Assistant:

void get_lifted_vertex(index_t v, double* result) const {
	    index_t instance = 0;
	    if(periodic_) {
		instance = periodic_vertex_instance(v);
		v = periodic_vertex_real(v);
	    }
	    result[0] = vertices_[3*v];
	    result[1] = vertices_[3*v+1];
	    result[2] = vertices_[3*v+2];
	    result[3] = -non_periodic_weight(v);
	    if(periodic_) {
		result[0] += double(translation[instance][0]) * period_;
		result[1] += double(translation[instance][1]) * period_;
		result[2] += double(translation[instance][2]) * period_;
	    }
	    result[3] +=
		geo_sqr(result[0]) + geo_sqr(result[1]) + geo_sqr(result[2]);
	}